

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

bool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::addPreceding
          (BreakCache *this,int32_t position,int32_t ruleStatusIdx,UpdatePositionValues update)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t nextIdx;
  UpdatePositionValues update_local;
  int32_t ruleStatusIdx_local;
  int32_t position_local;
  BreakCache *this_local;
  
  iVar1 = modChunkSize(this->fStartBufIdx + -1);
  if (iVar1 == this->fEndBufIdx) {
    if ((this->fBufIdx == this->fEndBufIdx) && (update == RetainCachePosition)) {
      return false;
    }
    iVar2 = modChunkSize(this->fEndBufIdx + -1);
    this->fEndBufIdx = iVar2;
  }
  this->fBoundaries[iVar1] = position;
  this->fStatuses[iVar1] = (uint16_t)ruleStatusIdx;
  this->fStartBufIdx = iVar1;
  if (update == UpdateCachePosition) {
    this->fBufIdx = iVar1;
    this->fTextIdx = position;
  }
  return true;
}

Assistant:

bool RuleBasedBreakIterator::BreakCache::addPreceding(int32_t position, int32_t ruleStatusIdx, UpdatePositionValues update) {
    U_ASSERT(position < fBoundaries[fStartBufIdx]);
    U_ASSERT(ruleStatusIdx <= UINT16_MAX);
    int32_t nextIdx = modChunkSize(fStartBufIdx - 1);
    if (nextIdx == fEndBufIdx) {
        if (fBufIdx == fEndBufIdx && update == RetainCachePosition) {
            // Failure. The insertion of the new boundary would claim the buffer position that is the
            // current iteration position. And we also want to retain the current iteration position.
            // (The buffer is already completely full of entries that precede the iteration position.)
            return false;
        }
        fEndBufIdx = modChunkSize(fEndBufIdx - 1);
    }
    fBoundaries[nextIdx] = position;
    fStatuses[nextIdx] = static_cast<uint16_t>(ruleStatusIdx);
    fStartBufIdx = nextIdx;
    if (update == UpdateCachePosition) {
        fBufIdx = nextIdx;
        fTextIdx = position;
    }
    return true;
}